

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fApiCase.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::ApiCase::ApiCase
          (ApiCase *this,Context *context,char *name,char *description)

{
  int iVar1;
  undefined4 extraout_var;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_0217f208;
  (this->super_TestCase).m_context = context;
  iVar1 = (*context->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&this->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var,iVar1),
             context->m_testCtx->m_log);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0218a018;
  this->m_log = (this->super_CallLogWrapper).m_log;
  return;
}

Assistant:

ApiCase::ApiCase (Context& context, const char* name, const char* description)
	: TestCase		(context, name, description)
	, CallLogWrapper(context.getRenderContext().getFunctions(), context.getTestContext().getLog())
	, m_log			(getLog())
{
}